

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split_pyr(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  uint uVar2;
  REF_STATUS RVar3;
  void *__ptr;
  REF_STATUS ref_private_macro_code_rss_99;
  REF_STATUS ref_private_macro_code_rss_98;
  REF_STATUS ref_private_macro_code_rss_97;
  REF_STATUS ref_private_macro_code_rss_96;
  REF_STATUS ref_private_macro_code_rss_95;
  REF_STATUS ref_private_macro_code_rss_94;
  REF_STATUS ref_private_macro_code_rss_93;
  REF_STATUS ref_private_macro_code_rss_92;
  REF_STATUS ref_private_macro_code_rss_91;
  REF_STATUS ref_private_macro_code_rss_90;
  REF_STATUS ref_private_macro_code_rss_89;
  REF_STATUS ref_private_macro_code_rss_88;
  REF_STATUS ref_private_macro_code_rss_87;
  REF_STATUS ref_private_macro_code_rss_86;
  REF_STATUS ref_private_macro_code_rss_85;
  REF_STATUS ref_private_macro_code_rss_84;
  REF_STATUS ref_private_macro_code_rss_83;
  REF_STATUS ref_private_macro_code_rss_82;
  REF_STATUS ref_private_macro_code_rss_81;
  REF_STATUS ref_private_macro_code_rss_80;
  REF_STATUS ref_private_macro_code_rss_79;
  REF_STATUS ref_private_macro_code_rss_78;
  REF_STATUS ref_private_macro_code_rss_77;
  REF_STATUS ref_private_macro_code_rss_76;
  REF_STATUS ref_private_macro_code_rss_75;
  REF_STATUS ref_private_macro_code_rss_74;
  REF_STATUS ref_private_macro_code_rss_73;
  REF_STATUS ref_private_macro_code_rss_72;
  REF_STATUS ref_private_macro_code_rss_71;
  REF_STATUS ref_private_macro_code_rss_70;
  REF_STATUS ref_private_macro_code_rss_69;
  REF_STATUS ref_private_macro_code_rss_68;
  REF_STATUS ref_private_macro_code_rss_67;
  REF_STATUS ref_private_macro_code_rss_66;
  REF_STATUS ref_private_macro_code_rss_65;
  REF_STATUS ref_private_macro_code_rss_64;
  REF_STATUS ref_private_macro_code_rss_63;
  REF_STATUS ref_private_macro_code_rss_62;
  REF_STATUS ref_private_macro_code_rss_61;
  REF_STATUS ref_private_macro_code_rss_60;
  REF_STATUS ref_private_macro_code_rss_59;
  REF_STATUS ref_private_macro_code_rss_58;
  REF_STATUS ref_private_macro_code_rss_57;
  REF_STATUS ref_private_macro_code_rss_56;
  REF_STATUS ref_private_macro_code_rss_55;
  REF_STATUS ref_private_macro_code_rss_54;
  REF_STATUS ref_private_macro_code_rss_53;
  REF_STATUS ref_private_macro_code_rss_52;
  REF_STATUS ref_private_macro_code_rss_51;
  REF_STATUS ref_private_macro_code_rss_50;
  REF_STATUS ref_private_macro_code_rss_49;
  REF_STATUS ref_private_macro_code_rss_48;
  REF_STATUS ref_private_macro_code_rss_47;
  REF_STATUS ref_private_macro_code_rss_46;
  REF_STATUS ref_private_macro_code_rss_45;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT node;
  REF_INT map;
  REF_INT *marked_for_removal;
  REF_INT local_138;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  REF_INT local_c4;
  REF_INT nodes [27];
  REF_CELL local_50;
  REF_CELL tet_split;
  REF_CELL pri_split;
  REF_CELL pyr_split;
  REF_CELL tet;
  REF_CELL pri;
  REF_CELL pyr;
  REF_SUBDIV pRStack_18;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  pri = ref_subdiv->grid->cell[9];
  pRStack_18 = ref_subdiv;
  if (pri->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x719,
           "ref_subdiv_split_pyr","malloc marked_for_removal of REF_INT negative");
    ref_subdiv_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)pri->max << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x719,"ref_subdiv_split_pyr","malloc marked_for_removal of REF_INT NULL");
      ref_subdiv_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < pri->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar1 = ref_cell_create(&pri_split,pri->type);
      if (uVar1 == 0) {
        tet = pRStack_18->grid->cell[10];
        uVar1 = ref_cell_create(&tet_split,tet->type);
        if (uVar1 == 0) {
          pyr_split = pRStack_18->grid->cell[8];
          uVar1 = ref_cell_create(&local_50,pyr_split->type);
          if (uVar1 == 0) {
            for (pyr._4_4_ = 0; (int)pyr._4_4_ < pri->max; pyr._4_4_ = pyr._4_4_ + 1) {
              if (((-1 < (int)pyr._4_4_) && ((int)pyr._4_4_ < pri->max)) &&
                 (pri->c2n[(int)(pri->size_per * pyr._4_4_)] != -1)) {
                uVar1 = ref_subdiv_map(pRStack_18,pri,pyr._4_4_);
                uVar2 = ref_cell_nodes(pri,pyr._4_4_,new_nodes + 0x1a);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x725,"ref_subdiv_split_pyr",(ulong)uVar2,"nodes");
                  return uVar2;
                }
                if (uVar1 != 0) {
                  if (uVar1 == 0x14) {
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x741,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[1],&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x744,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[2],&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x747,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x748,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x74a,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between
                                      (pRStack_18,new_nodes[0x1a],nodes[1],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x74d,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[2],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x750,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x751,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                  else if (uVar1 == 0x22) {
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x76b,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x76e,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[0],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x771,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x772,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x774,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x777,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[0],new_nodes + 3);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x77a,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(tet_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x77b,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                  else if (uVar1 == 0x40) {
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7c5,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7c8,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7c9,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    local_138 = new_nodes[0x1a];
                    new_cell = local_c4;
                    new_nodes[0] = nodes[0];
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,2000,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_50,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7d1,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    local_138 = new_nodes[0x1a];
                    new_cell = nodes[0];
                    new_nodes[0] = nodes[1];
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7d8,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_50,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7d9,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                  else if (uVar1 == 0x48) {
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x756,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x759,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x75c,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x75d,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x75f,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x762,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 3);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x765,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(tet_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x766,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                  else if (uVar1 == 0x5c) {
LAB_002a52a1:
                    if (uVar1 == 0xe1) {
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        (&local_138)[ref_private_macro_code_rss] =
                             new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                      }
                      new_nodes[0x1a] = new_nodes[2];
                      local_c4 = new_nodes[1];
                      nodes[0] = new_nodes[0];
                      nodes[1] = new_cell;
                      nodes[2] = local_138;
                    }
                    if (uVar1 == 0x5c) {
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        (&local_138)[ref_private_macro_code_rss] =
                             new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                      }
                      new_nodes[0x1a] = new_cell;
                      local_c4 = new_nodes[2];
                      nodes[0] = new_nodes[0];
                      nodes[1] = local_138;
                      nodes[2] = new_nodes[1];
                    }
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      (&local_138)[ref_private_macro_code_rss] =
                           new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7f7,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7fa,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7fd,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7fe,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      (&local_138)[ref_private_macro_code_rss] =
                           new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x803,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x806,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x809,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x80a,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      (&local_138)[ref_private_macro_code_rss] =
                           new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                    }
                    local_138 = new_nodes[2];
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x811,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x814,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_50,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x815,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      (&local_138)[ref_private_macro_code_rss] =
                           new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x81a,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    new_cell = new_nodes[1];
                    uVar1 = ref_subdiv_node_between
                                      (pRStack_18,new_nodes[0x1a],nodes[0],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x81e,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_50,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x81f,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      (&local_138)[ref_private_macro_code_rss] =
                           new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x825,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x828,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x82b,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_50,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x82c,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 5;
                        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                      (&local_138)[ref_private_macro_code_rss] =
                           new_nodes[(long)ref_private_macro_code_rss + 0x1a];
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x831,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x834,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x837,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x83a,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_50,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x83b,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                  else if (uVar1 == 0x81) {
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x72c,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x72f,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x732,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x733,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x735,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x738,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x73b,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x73c,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                  else {
                    if ((uVar1 == 0x8b) || (uVar1 == 0xe1)) goto LAB_002a52a1;
                    if (uVar1 != 0xeb) {
                      uVar2 = ref_subdiv_map_to_edge(uVar1);
                      if (uVar2 == 0) {
                        printf("pyr %d, map %d\n",(ulong)pyr._4_4_,(ulong)uVar1);
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x841,"ref_subdiv_split_pyr",6,"map not implemented yet");
                        return 6;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x83f,"ref_subdiv_split_pyr",(ulong)uVar2,"map2edge");
                      return uVar2;
                    }
                    *(undefined4 *)((long)__ptr + (long)(int)pyr._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x780,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x783,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x786,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[0],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x789,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x78c,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(pri_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x78d,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x791,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x794,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],new_nodes[0x1a],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x797,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x79a,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x79d,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],nodes[1],new_nodes + 3);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7a0,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(tet_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7a1,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7a3,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7a6,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7a9,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 2);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7ac,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[0],new_nodes + 3);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7af,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(tet_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7b0,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(pri,pyr._4_4_,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7b2,"ref_subdiv_split_pyr",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_c4,&local_138);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7b5,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,local_c4,nodes[0],new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7b8,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7bb,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[0],new_nodes + 3);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7be,"ref_subdiv_split_pyr",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(tet_split,&local_138,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x7bf,"ref_subdiv_split_pyr",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                }
              }
            }
            for (pyr._4_4_ = 0; (int)pyr._4_4_ < pri->max; pyr._4_4_ = pyr._4_4_ + 1) {
              if ((*(int *)((long)__ptr + (long)(int)pyr._4_4_ * 4) == 1) &&
                 (uVar1 = ref_cell_remove(pri,pyr._4_4_), uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x847,"ref_subdiv_split_pyr",(ulong)uVar1,"remove");
                return uVar1;
              }
            }
            for (pyr._4_4_ = 0; (int)pyr._4_4_ < pri_split->max; pyr._4_4_ = pyr._4_4_ + 1) {
              RVar3 = ref_cell_nodes(pri_split,pyr._4_4_,new_nodes + 0x1a);
              if ((RVar3 == 0) &&
                 (uVar1 = ref_subdiv_add_local_cell(pRStack_18,pri,new_nodes + 0x1a), uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x84a,"ref_subdiv_split_pyr",(ulong)uVar1,"add local");
                return uVar1;
              }
            }
            for (pyr._4_4_ = 0; (int)pyr._4_4_ < tet_split->max; pyr._4_4_ = pyr._4_4_ + 1) {
              RVar3 = ref_cell_nodes(tet_split,pyr._4_4_,new_nodes + 0x1a);
              if ((RVar3 == 0) &&
                 (uVar1 = ref_subdiv_add_local_cell(pRStack_18,tet,new_nodes + 0x1a), uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x84d,"ref_subdiv_split_pyr",(ulong)uVar1,"add local");
                return uVar1;
              }
            }
            for (pyr._4_4_ = 0; (int)pyr._4_4_ < local_50->max; pyr._4_4_ = pyr._4_4_ + 1) {
              RVar3 = ref_cell_nodes(local_50,pyr._4_4_,new_nodes + 0x1a);
              if ((RVar3 == 0) &&
                 (uVar1 = ref_subdiv_add_local_cell(pRStack_18,pyr_split,new_nodes + 0x1a),
                 uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x850,"ref_subdiv_split_pyr",(ulong)uVar1,"add local");
                return uVar1;
              }
            }
            uVar1 = ref_cell_free(pri_split);
            if (uVar1 == 0) {
              uVar1 = ref_cell_free(tet_split);
              if (uVar1 == 0) {
                uVar1 = ref_cell_free(local_50);
                if (uVar1 == 0) {
                  free(__ptr);
                  ref_subdiv_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x854,"ref_subdiv_split_pyr",(ulong)uVar1,"temp pri free");
                  ref_subdiv_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x853,"ref_subdiv_split_pyr",(ulong)uVar1,"temp pri free");
                ref_subdiv_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x852,"ref_subdiv_split_pyr",(ulong)uVar1,"temp pyr free");
              ref_subdiv_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x721,"ref_subdiv_split_pyr",(ulong)uVar1,"temp pri");
            ref_subdiv_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x71e,"ref_subdiv_split_pyr",(ulong)uVar1,"temp pri");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x71b,"ref_subdiv_split_pyr",(ulong)uVar1,"temp pyr");
        ref_subdiv_local._4_4_ = uVar1;
      }
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_pyr(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL pyr, pri, tet;
  REF_CELL pyr_split, pri_split, tet_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;
  REF_INT node;

  pyr = ref_grid_pyr(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(pyr), REF_INT, 0);

  RSS(ref_cell_create(&pyr_split, ref_cell_type(pyr)), "temp pyr");

  pri = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&pri_split, ref_cell_type(pri)), "temp pri");

  tet = ref_grid_tet(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&tet_split, ref_cell_type(tet)), "temp pri");

  each_ref_cell_valid_cell(pyr, cell) {
    map = ref_subdiv_map(ref_subdiv, pyr, cell);
    RSS(ref_cell_nodes(pyr, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 129: /* split into two pyr on edges 0, 7*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");
        break;
      case 20: /* split into two pyr on edges 2, 4*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");
        break;
      case 72: /* split into pyr and pri edge 3-6 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");
        break;
      case 34: /* split into pyr and pri edge 1-5 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");
        break;
      case 235: /* split into 1 pyr, 2 pri*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(pri_split, new_nodes, &new_cell), "add");

        break;
      case 64: /* split into 1 pyr, 3 tet, on edge 6, nodes 2, 4*/
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(pyr, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        new_nodes[0] = nodes[0];
        new_nodes[1] = nodes[1];
        new_nodes[2] = nodes[2];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        new_nodes[0] = nodes[0];
        new_nodes[1] = nodes[2];
        new_nodes[2] = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        break;
      case 139:
      case 225:
      case 92:

        if (225 == map) {
          for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
          nodes[0] = new_nodes[4];
          nodes[1] = new_nodes[3];
          nodes[2] = new_nodes[2];
          nodes[3] = new_nodes[1];
          nodes[4] = new_nodes[0];
        }

        if (92 == map) {
          for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
          nodes[0] = new_nodes[1];
          nodes[1] = new_nodes[4];
          nodes[2] = new_nodes[2];
          nodes[3] = new_nodes[0];
          nodes[4] = new_nodes[3];
        }

        marked_for_removal[cell] = 1;

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(pyr_split, new_nodes, &new_cell), "add");

        /* top sides */
        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        new_nodes[0] = new_nodes[4];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[0])),
            "mis");
        new_nodes[1] = new_nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        /* center */
        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 5; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(tet_split, new_nodes, &new_cell), "add");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pyr %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(pyr); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(pyr, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(pyr_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, pyr, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(pri_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, pri, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(tet_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, tet, nodes), "add local");

  RSS(ref_cell_free(pyr_split), "temp pyr free");
  RSS(ref_cell_free(pri_split), "temp pri free");
  RSS(ref_cell_free(tet_split), "temp pri free");

  free(marked_for_removal);

  return REF_SUCCESS;
}